

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

size_t coda_strxspn(char *s,char *n,size_t len)

{
  char cVar1;
  __int32_t **pp_Var2;
  char *pcVar3;
  char *pcVar4;
  
  for (pcVar3 = s; pcVar4 = n, pcVar3 < s + len; pcVar3 = pcVar3 + 1) {
    do {
      cVar1 = *pcVar4;
      if ((long)cVar1 == 0) goto LAB_00106230;
      pp_Var2 = __ctype_tolower_loc();
      pcVar4 = pcVar4 + 1;
    } while ((*pp_Var2)[*pcVar3] != (*pp_Var2)[cVar1]);
  }
LAB_00106230:
  return (long)pcVar3 - (long)s;
}

Assistant:

size_t coda_strxspn(const char *s, const char *n, size_t len)
{
	const char *p = s;
	const char *e = s + len;
	const char *x;

	for (; p < e; ++p)
	{
		for (x = n; *x; ++x)
		{
			if (tolower(*p) == tolower(*x)) break;
		}

		if (!*x) break;
	}

	return p - s;
}